

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hh
# Opt level: O2

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
__thiscall
tchecker::syncprod::details::
state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>::
construct_from_state<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,unsigned_long,1ul>>&>
          (state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>
           *this,make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *s,
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
          *args,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
                *args_1)

{
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
  local_40 [2];
  
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::operator*
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
              *)args);
  pool_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>::
  construct<tchecker::vloc_t_const&>
            ((pool_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>> *)local_40,
             (vloc_t *)(s + 4));
  pool_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>>::
  construct<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>const&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,unsigned_long,1ul>>&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t,unsigned_long,1ul>>&>
            ((pool_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>> *)this,s,
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
              *)args,(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                      *)local_40,args_1);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t(local_40);
  return (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
          )(make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL> *)this;
}

Assistant:

tchecker::intrusive_shared_ptr_t<STATE> construct_from_state(STATE const & s, ARGS &&... args)
  {
    return tchecker::ts::state_pool_allocator_t<STATE>::construct_from_state(s, _vloc_pool.construct(s.vloc()), args...);
  }